

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionTest_OnePolicyWithCustomQualifier_Test::
TestBody(ParseCertificatePoliciesExtensionTest_OnePolicyWithCustomQualifier_Test *this)

{
  pointer rhs;
  pointer pPVar1;
  bool bVar2;
  pointer *__ptr;
  CertErrors *in_R8;
  char *pcVar3;
  char *in_R9;
  Input extension_value;
  AssertHelper local_a8;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  uint8_t kExpectedQualifier [4];
  vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> policies;
  CertErrors errors;
  uint8_t kExpectedQualifierOid [3];
  string der;
  
  der._M_dataplus._M_p = (pointer)&der.field_2;
  der._M_string_length = 0;
  der.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"policy_1_2_3_with_custom_qualifier.pem",(allocator<char> *)&errors
            );
  LoadTestData((anon_unknown_0 *)&policies,(string *)&gtest_ar,&der);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)policies.
            super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&errors);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&policies,
               (AssertionResult *)"LoadTestData(\"policy_1_2_3_with_custom_qualifier.pem\", &der)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0xf6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&errors);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    ::std::__cxx11::string::~string((string *)&gtest_ar);
    if (errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)errors.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&policies.
                      super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    goto LAB_001f1d9f;
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&policies.
                    super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  policies.super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  policies.super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  policies.super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CertErrors::CertErrors(&errors);
  extension_value.data_.size_ = (size_t)&policies;
  extension_value.data_.data_ = (uchar *)der._M_string_length;
  bVar2 = ParseCertificatePoliciesExtension
                    ((bssl *)der._M_dataplus._M_p,extension_value,
                     (vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> *)
                     &errors,in_R8);
  gtest_ar__1.success_ = bVar2;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "ParseCertificatePoliciesExtension(StringAsBytes(der), &policies, &errors)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)kExpectedQualifier,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0xfa,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)kExpectedQualifier,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)kExpectedQualifier);
    ::std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  local_a8.data_._0_4_ = 1;
  gtest_ar__1._0_8_ =
       ((long)policies.
              super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       (long)policies.
             super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>.
             _M_impl.super__Vector_impl_data._M_start) / 0x28;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"1U","policies.size()",(uint *)&local_a8,
             (unsigned_long *)&gtest_ar__1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0xfb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar__1);
LAB_001f1c72:
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    pPVar1 = policies.
             super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    gtest_ar__1._0_8_ = &(anonymous_namespace)::policy_1_2_3_der;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x2;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)&gtest_ar,"der::Input(policy_1_2_3_der)","policy.policy_oid",
               (Input *)&gtest_ar__1,
               &(policies.
                 super__Vector_base<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start)->policy_oid);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0xfd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_a8.data_._0_4_ = 1;
    gtest_ar__1._0_8_ =
         (long)(pPVar1->policy_qualifiers).
               super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pPVar1->policy_qualifiers).
               super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"1U","policy.policy_qualifiers.size()",(uint *)&local_a8,
               (unsigned_long *)&gtest_ar__1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0xff,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar__1);
      goto LAB_001f1c72;
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    rhs = (pPVar1->policy_qualifiers).
          super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>.
          _M_impl.super__Vector_impl_data._M_start;
    gtest_ar__1._0_8_ = kExpectedQualifierOid;
    kExpectedQualifierOid[2] = '\x04';
    kExpectedQualifierOid[0] = '*';
    kExpectedQualifierOid[1] = '\x03';
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x3;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)&gtest_ar,"der::Input(kExpectedQualifierOid)","qualifier.qualifier_oid",
               (Input *)&gtest_ar__1,&rhs->qualifier_oid);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x103,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar__1._0_8_ = kExpectedQualifier;
    builtin_memcpy(kExpectedQualifier,"\f\x02hi",4);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x4;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)&gtest_ar,"der::Input(kExpectedQualifier)","qualifier.qualifier",
               (Input *)&gtest_ar__1,&rhs->qualifier);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x106,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  CertErrors::~CertErrors(&errors);
  ::std::vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>::~vector
            (&policies);
LAB_001f1d9f:
  ::std::__cxx11::string::~string((string *)&der);
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}